

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commandline.h
# Opt level: O1

void __thiscall
CommandLine::addOption<bool&,char,char_const(&)[5],char_const(&)[16]>
          (CommandLine *this,bool *args,char *args_1,char (*args_2) [5],char (*args_3) [16])

{
  iterator *piVar1;
  _Elt_pointer ppCVar2;
  CommandLineOption *this_00;
  CommandLineOption *local_38;
  
  this_00 = (CommandLineOption *)operator_new(0x60);
  CommandLineOption::CommandLineOption<bool>(this_00,args,*args_1,*args_2,*args_3);
  ppCVar2 = (this->_options)._deque.
            super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  if (ppCVar2 ==
      (this->_options)._deque.
      super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_last + -1) {
    local_38 = this_00;
    std::deque<CommandLineOption*,std::allocator<CommandLineOption*>>::
    _M_push_back_aux<CommandLineOption*const&>
              ((deque<CommandLineOption*,std::allocator<CommandLineOption*>> *)this,&local_38);
  }
  else {
    *ppCVar2 = this_00;
    piVar1 = &(this->_options)._deque.
              super__Deque_base<CommandLineOption_*,_std::allocator<CommandLineOption_*>_>._M_impl.
              super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  return;
}

Assistant:

void addOption (Args&&... args)
	{
		_options << new CommandLineOption (args...);
	}